

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void fe_sub(fe_loose *h,fe *f,fe *g)

{
  int iVar1;
  uint local_2c;
  uint local_28;
  uint _assert_fe_i_2;
  uint _assert_fe_i_1;
  uint _assert_fe_i;
  fe *g_local;
  fe *f_local;
  fe_loose *h_local;
  
  _assert_fe_i_2 = 0;
  while( true ) {
    if (4 < _assert_fe_i_2) {
      local_28 = 0;
      while( true ) {
        if (4 < local_28) {
          fiat_25519_sub(h->v,f->v,g->v);
          local_2c = 0;
          while( true ) {
            if (4 < local_2c) {
              return;
            }
            iVar1 = constant_time_declassify_int((uint)(h->v[local_2c] < 0x1a666666666665));
            if (iVar1 == 0) break;
            local_2c = local_2c + 1;
          }
          __assert_fail("constant_time_declassify_int(h->v[_assert_fe_i] <= 0x1a666666666664UL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                        ,0xc9,"void fe_sub(fe_loose *, const fe *, const fe *)");
        }
        iVar1 = constant_time_declassify_int((uint)(g->v[local_28] < 0x8cccccccccccd));
        if (iVar1 == 0) break;
        local_28 = local_28 + 1;
      }
      __assert_fail("constant_time_declassify_int(g->v[_assert_fe_i] <= 0x8ccccccccccccUL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,199,"void fe_sub(fe_loose *, const fe *, const fe *)");
    }
    iVar1 = constant_time_declassify_int((uint)(f->v[_assert_fe_i_2] < 0x8cccccccccccd));
    if (iVar1 == 0) break;
    _assert_fe_i_2 = _assert_fe_i_2 + 1;
  }
  __assert_fail("constant_time_declassify_int(f->v[_assert_fe_i] <= 0x8ccccccccccccUL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                ,0xc6,"void fe_sub(fe_loose *, const fe *, const fe *)");
}

Assistant:

static void fe_sub(fe_loose *h, const fe *f, const fe *g) {
  assert_fe(f->v);
  assert_fe(g->v);
  fiat_25519_sub(h->v, f->v, g->v);
  assert_fe_loose(h->v);
}